

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O2

char * __thiscall Qentem::String<char>::allocate(String<char> *this,SizeT new_size)

{
  char *pointer;
  
  pointer = (char *)operator_new((ulong)new_size);
  MemoryRecord::AddAllocation(pointer);
  this->storage_ = pointer;
  return pointer;
}

Assistant:

Char_T *allocate(SizeT new_size) {
        Char_T *ns = Memory::Allocate<Char_T>(new_size);

        setStorage(ns);

        return ns;
    }